

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_update_decoder.cpp
# Opt level: O2

PriceField __thiscall
bidfx_public_api::price::pixie::PriceUpdateDecoder::DecodeAsInteger
          (PriceUpdateDecoder *this,ByteBuffer *buffer,FieldDef *field_def)

{
  FieldEncodingEnum FVar1;
  int16_t iVar2;
  uint32_t uVar3;
  uint uVar4;
  int64_t iVar5;
  uint64_t uVar6;
  anon_union_8_4_08ebdfac_for_PriceField_2 extraout_RDX;
  anon_union_8_4_08ebdfac_for_PriceField_2 extraout_RDX_00;
  anon_union_8_4_08ebdfac_for_PriceField_2 aVar7;
  PriceField PVar8;
  
  FVar1 = field_def->encoding_;
  switch(FVar1) {
  case FIXED1:
    uVar4 = (**(buffer->super_InputStream)._vptr_InputStream)(buffer);
    uVar4 = uVar4 & 0xff;
    break;
  case FIXED2:
    iVar2 = tools::ByteBuffer::ReadShort(buffer);
    uVar4 = (uint)iVar2;
    break;
  case FIXED3:
    uVar4 = tools::ByteBuffer::ReadMedium(buffer);
    break;
  case FIXED4:
    uVar4 = tools::ByteBuffer::ReadInt(buffer);
    break;
  case 0x35:
  case 0x36:
  case 0x37:
switchD_001ce61d_caseD_35:
    SkipFieldValue(buffer,(FieldDef *)buffer);
    PriceField::PriceField((PriceField *)this);
    aVar7 = extraout_RDX;
    goto LAB_001ce6b4;
  case FIXED8:
    iVar5 = tools::ByteBuffer::ReadLong(buffer);
    uVar4 = (uint)iVar5;
    break;
  default:
    if (FVar1 == VARINT) {
      uVar3 = tools::Varint::ReadU32(&buffer->super_InputStream);
      uVar6 = EncodingUtil::PowerOfTen(field_def->scale_);
      uVar4 = uVar3 * (int)uVar6;
    }
    else {
      if (FVar1 != ZIGZAG) goto switchD_001ce61d_caseD_35;
      uVar3 = tools::Varint::ReadU32(&buffer->super_InputStream);
      uVar4 = tools::Varint::ZigzagToInt(uVar3);
    }
  }
  PriceField::PriceField((PriceField *)this,uVar4);
  aVar7 = extraout_RDX_00;
LAB_001ce6b4:
  PVar8.field_1.long_value_ = aVar7.long_value_;
  PVar8._0_8_ = this;
  return PVar8;
}

Assistant:

PriceField PriceUpdateDecoder::DecodeAsInteger(ByteBuffer& buffer, FieldDef& field_def)
{
    switch (field_def.encoding_)
    {
        case FIXED1:
            return PriceField((int32_t) buffer.ReadByte());
        case FIXED2:
            return PriceField((int32_t) buffer.ReadShort());
        case FIXED3:
            return PriceField(buffer.ReadMedium());
        case FIXED4:
            return PriceField(buffer.ReadInt());
        case FIXED8:
            return PriceField((int32_t) buffer.ReadLong());
        case VARINT:
            return PriceField((int32_t) tools::Varint::ReadU32(buffer) * (int32_t) EncodingUtil::PowerOfTen(field_def.scale_));
        case ZIGZAG:
            return PriceField(Varint::ZigzagToInt(tools::Varint::ReadU32(buffer)));
    }
    SkipFieldValue(buffer, field_def);
    return PriceField();
}